

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbannouncer.cpp
# Opt level: O0

bool AnnounceTelefrag(AActor *killer,AActor *killee)

{
  bool bVar1;
  int iVar2;
  int gender;
  char *from;
  char *victim;
  char *killer_00;
  char local_438 [8];
  char assembled [1024];
  char *message;
  int rannum;
  AActor *killee_local;
  AActor *killer_local;
  
  iVar2 = FRandom::operator()(&pr_bbannounce);
  bVar1 = FBoolCVar::operator_cast_to_bool(&cl_bbannounce);
  if ((bVar1) && ((multiplayer & 1U) != 0)) {
    from = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG");
    if (from != (char *)0x0) {
      gender = userinfo_t::GetGender(&killee->player->userinfo);
      victim = userinfo_t::GetName(&killee->player->userinfo);
      killer_00 = userinfo_t::GetName(&killer->player->userinfo);
      SexMessage(from,local_438,gender,victim,killer_00);
      Printf(1,"%s\n",local_438);
    }
    bVar1 = AActor::CheckLocalView(killee,consoleplayer);
    if ((bVar1) || (bVar1 = AActor::CheckLocalView(killer,consoleplayer), bVar1)) {
      DoVoiceAnnounce(TelefragSounds[iVar2 % 7]);
    }
    killer_local._7_1_ = from != (char *)0x0;
  }
  else {
    killer_local._7_1_ = false;
  }
  return killer_local._7_1_;
}

Assistant:

bool AnnounceTelefrag (AActor *killer, AActor *killee)
{
	int rannum = pr_bbannounce();

	if (cl_bbannounce && multiplayer)
	{
		const char *message = GStrings("OB_MPTELEFRAG");
		if (message != NULL)
		{
			char assembled[1024];

			SexMessage (message, assembled, killee->player->userinfo.GetGender(),
				killee->player->userinfo.GetName(), killer->player->userinfo.GetName());
			Printf (PRINT_MEDIUM, "%s\n", assembled);
		}
		if (killee->CheckLocalView (consoleplayer) ||
			killer->CheckLocalView (consoleplayer))
		{
			DoVoiceAnnounce (TelefragSounds[rannum % 7]);
		}
		return message != NULL;
	}
	return false;
}